

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_ssse3_intr.c
# Opt level: O3

void ihevc_weighted_pred_uni_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD32 wgt0,
               WORD32 off0,WORD32 shift,WORD32 lvl_shift,WORD32 ht,WORD32 wd)

{
  UWORD8 *pUVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  unkbyte10 Var41;
  unkbyte10 Var42;
  unkbyte10 Var43;
  unkbyte10 Var44;
  int iVar45;
  int iVar46;
  long lVar47;
  WORD16 *pWVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  short sVar52;
  undefined4 uVar53;
  short sVar57;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar58;
  int iVar59;
  int iVar60;
  short sVar61;
  undefined1 auVar62 [16];
  int iVar63;
  short sVar67;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar71;
  short sVar75;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar76;
  undefined1 auVar79 [16];
  int iVar80;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  undefined1 auVar88 [16];
  int iVar89;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar64 [12];
  undefined1 auVar72 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [16];
  undefined1 auVar81 [12];
  undefined1 auVar82 [16];
  undefined1 auVar86 [12];
  undefined1 auVar87 [16];
  undefined1 auVar90 [12];
  undefined1 auVar91 [16];
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x84,
                  "void ihevc_weighted_pred_uni_ssse3(WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((ht & 3U) != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x85,
                  "void ihevc_weighted_pred_uni_ssse3(WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar50 = 1 << ((char)shift - 1U & 0x1f);
  auVar54 = pshuflw(ZEXT416((uint)lvl_shift),ZEXT416((uint)lvl_shift),0);
  uVar53 = auVar54._0_4_;
  auVar66._4_4_ = uVar53;
  auVar66._0_4_ = uVar53;
  auVar66._8_4_ = uVar53;
  auVar66._12_4_ = uVar53;
  auVar55 = pshuflw(ZEXT416((uint)wgt0),ZEXT416((uint)wgt0),0);
  auVar56._0_4_ = auVar55._0_4_;
  auVar56._4_4_ = auVar56._0_4_;
  auVar56._8_4_ = auVar56._0_4_;
  auVar56._12_4_ = auVar56._0_4_;
  sVar52 = auVar55._0_2_;
  sVar57 = auVar55._2_2_;
  sVar61 = auVar54._2_2_ * sVar57;
  auVar55 = pmulhw(auVar66,auVar56);
  iVar51 = CONCAT22(auVar55._6_2_,sVar61);
  Var41 = CONCAT64(CONCAT42(iVar51,auVar55._4_2_),CONCAT22(auVar54._0_2_ * sVar52,sVar61));
  auVar34._4_8_ = (long)((unkuint10)Var41 >> 0x10);
  auVar34._2_2_ = auVar55._2_2_;
  auVar34._0_2_ = auVar54._2_2_ * sVar57;
  iVar58 = iVar50 + CONCAT22(auVar55._0_2_,auVar54._0_2_ * sVar52);
  iVar59 = iVar50 + auVar34._0_4_;
  iVar60 = iVar50 + (int)((unkuint10)Var41 >> 0x10);
  iVar50 = iVar50 + iVar51;
  if ((wd & 4U) == 0) {
    if (0 < ht) {
      iVar51 = 0;
      auVar54 = ZEXT416((uint)shift);
      do {
        if (0 < wd) {
          lVar49 = 0;
          pWVar48 = pi2_src;
          do {
            auVar55 = *(undefined1 (*) [16])(pi2_src + lVar49);
            auVar66 = *(undefined1 (*) [16])(pi2_src + src_strd + lVar49);
            auVar69 = *(undefined1 (*) [16])(pi2_src + src_strd * 2 + lVar49);
            auVar74 = *(undefined1 (*) [16])(pi2_src + src_strd * 3 + lVar49);
            sVar61 = auVar55._6_2_ * sVar57;
            sVar67 = auVar66._6_2_ * sVar57;
            sVar70 = auVar69._6_2_ * sVar57;
            sVar75 = auVar74._6_2_ * sVar57;
            auVar93 = pmulhw(auVar55,auVar56);
            auVar94 = pmulhw(auVar66,auVar56);
            auVar95 = pmulhw(auVar69,auVar56);
            auVar96 = pmulhw(auVar74,auVar56);
            iVar89 = CONCAT22(auVar93._8_2_,auVar55._8_2_ * sVar52);
            auVar90._0_8_ = CONCAT26(auVar93._10_2_,CONCAT24(auVar55._10_2_ * sVar57,iVar89));
            auVar90._8_2_ = auVar55._12_2_ * sVar52;
            auVar90._10_2_ = auVar93._12_2_;
            auVar91._12_2_ = auVar55._14_2_ * sVar57;
            auVar91._0_12_ = auVar90;
            auVar91._14_2_ = auVar93._14_2_;
            iVar85 = CONCAT22(auVar94._8_2_,auVar66._8_2_ * sVar52);
            auVar86._0_8_ = CONCAT26(auVar94._10_2_,CONCAT24(auVar66._10_2_ * sVar57,iVar85));
            auVar86._8_2_ = auVar66._12_2_ * sVar52;
            auVar86._10_2_ = auVar94._12_2_;
            auVar87._12_2_ = auVar66._14_2_ * sVar57;
            auVar87._0_12_ = auVar86;
            auVar87._14_2_ = auVar94._14_2_;
            iVar80 = CONCAT22(auVar95._8_2_,auVar69._8_2_ * sVar52);
            auVar81._0_8_ = CONCAT26(auVar95._10_2_,CONCAT24(auVar69._10_2_ * sVar57,iVar80));
            auVar81._8_2_ = auVar69._12_2_ * sVar52;
            auVar81._10_2_ = auVar95._12_2_;
            auVar82._12_2_ = auVar69._14_2_ * sVar57;
            auVar82._0_12_ = auVar81;
            auVar82._14_2_ = auVar95._14_2_;
            iVar76 = CONCAT22(auVar96._8_2_,auVar74._8_2_ * sVar52);
            auVar77._0_8_ = CONCAT26(auVar96._10_2_,CONCAT24(auVar74._10_2_ * sVar57,iVar76));
            auVar77._8_2_ = auVar74._12_2_ * sVar52;
            auVar77._10_2_ = auVar96._12_2_;
            auVar78._12_2_ = auVar74._14_2_ * sVar57;
            auVar78._0_12_ = auVar77;
            auVar78._14_2_ = auVar96._14_2_;
            iVar45 = CONCAT22(auVar93._6_2_,sVar61);
            Var41 = CONCAT64(CONCAT42(iVar45,auVar93._4_2_),CONCAT22(auVar55._4_2_ * sVar52,sVar61))
            ;
            auVar35._4_8_ = (long)((unkuint10)Var41 >> 0x10);
            auVar35._2_2_ = auVar93._2_2_;
            auVar35._0_2_ = auVar55._2_2_ * sVar57;
            iVar46 = CONCAT22(auVar94._6_2_,sVar67);
            Var42 = CONCAT64(CONCAT42(iVar46,auVar94._4_2_),CONCAT22(auVar66._4_2_ * sVar52,sVar67))
            ;
            auVar36._4_8_ = (long)((unkuint10)Var42 >> 0x10);
            auVar36._2_2_ = auVar94._2_2_;
            auVar36._0_2_ = auVar66._2_2_ * sVar57;
            iVar63 = CONCAT22(auVar95._6_2_,sVar70);
            Var43 = CONCAT64(CONCAT42(iVar63,auVar95._4_2_),CONCAT22(auVar69._4_2_ * sVar52,sVar70))
            ;
            auVar37._4_8_ = (long)((unkuint10)Var43 >> 0x10);
            auVar37._2_2_ = auVar95._2_2_;
            auVar37._0_2_ = auVar69._2_2_ * sVar57;
            iVar71 = CONCAT22(auVar96._6_2_,sVar75);
            Var44 = CONCAT64(CONCAT42(iVar71,auVar96._4_2_),CONCAT22(auVar74._4_2_ * sVar52,sVar75))
            ;
            auVar38._4_8_ = (long)((unkuint10)Var44 >> 0x10);
            auVar38._2_2_ = auVar96._2_2_;
            auVar38._0_2_ = auVar74._2_2_ * sVar57;
            auVar62._0_4_ =
                 (CONCAT22(auVar93._0_2_,auVar55._0_2_ * sVar52) + iVar58 >> auVar54) + off0;
            auVar62._4_4_ = (auVar35._0_4_ + iVar59 >> auVar54) + off0;
            auVar62._8_4_ = ((int)((unkuint10)Var41 >> 0x10) + iVar60 >> auVar54) + off0;
            auVar62._12_4_ = (iVar45 + iVar50 >> auVar54) + off0;
            auVar65._0_4_ =
                 (CONCAT22(auVar94._0_2_,auVar66._0_2_ * sVar52) + iVar58 >> auVar54) + off0;
            auVar65._4_4_ = (auVar36._0_4_ + iVar59 >> auVar54) + off0;
            auVar65._8_4_ = ((int)((unkuint10)Var42 >> 0x10) + iVar60 >> auVar54) + off0;
            auVar65._12_4_ = (iVar46 + iVar50 >> auVar54) + off0;
            auVar68._0_4_ =
                 (CONCAT22(auVar95._0_2_,auVar69._0_2_ * sVar52) + iVar58 >> auVar54) + off0;
            auVar68._4_4_ = (auVar37._0_4_ + iVar59 >> auVar54) + off0;
            auVar68._8_4_ = ((int)((unkuint10)Var43 >> 0x10) + iVar60 >> auVar54) + off0;
            auVar68._12_4_ = (iVar63 + iVar50 >> auVar54) + off0;
            auVar73._0_4_ =
                 (CONCAT22(auVar96._0_2_,auVar74._0_2_ * sVar52) + iVar58 >> auVar54) + off0;
            auVar73._4_4_ = (auVar38._0_4_ + iVar59 >> auVar54) + off0;
            auVar73._8_4_ = ((int)((unkuint10)Var44 >> 0x10) + iVar60 >> auVar54) + off0;
            auVar73._12_4_ = (iVar71 + iVar50 >> auVar54) + off0;
            auVar92._0_4_ = (iVar89 + iVar58 >> auVar54) + off0;
            auVar92._4_4_ = ((int)((ulong)auVar90._0_8_ >> 0x20) + iVar59 >> auVar54) + off0;
            auVar92._8_4_ = (auVar90._8_4_ + iVar60 >> auVar54) + off0;
            auVar92._12_4_ = (auVar91._12_4_ + iVar50 >> auVar54) + off0;
            auVar55 = packssdw(auVar62,auVar92);
            sVar61 = auVar55._0_2_;
            sVar6 = auVar55._2_2_;
            sVar10 = auVar55._4_2_;
            sVar14 = auVar55._6_2_;
            sVar18 = auVar55._8_2_;
            sVar22 = auVar55._10_2_;
            sVar26 = auVar55._12_2_;
            sVar30 = auVar55._14_2_;
            auVar88._0_4_ = (iVar85 + iVar58 >> auVar54) + off0;
            auVar88._4_4_ = ((int)((ulong)auVar86._0_8_ >> 0x20) + iVar59 >> auVar54) + off0;
            auVar88._8_4_ = (auVar86._8_4_ + iVar60 >> auVar54) + off0;
            auVar88._12_4_ = (auVar87._12_4_ + iVar50 >> auVar54) + off0;
            auVar66 = packssdw(auVar65,auVar88);
            sVar67 = auVar66._0_2_;
            sVar7 = auVar66._2_2_;
            sVar11 = auVar66._4_2_;
            sVar15 = auVar66._6_2_;
            sVar19 = auVar66._8_2_;
            sVar23 = auVar66._10_2_;
            sVar27 = auVar66._12_2_;
            sVar31 = auVar66._14_2_;
            auVar83._0_4_ = (iVar80 + iVar58 >> auVar54) + off0;
            auVar83._4_4_ = ((int)((ulong)auVar81._0_8_ >> 0x20) + iVar59 >> auVar54) + off0;
            auVar83._8_4_ = (auVar81._8_4_ + iVar60 >> auVar54) + off0;
            auVar83._12_4_ = (auVar82._12_4_ + iVar50 >> auVar54) + off0;
            auVar69 = packssdw(auVar68,auVar83);
            sVar70 = auVar69._0_2_;
            sVar8 = auVar69._2_2_;
            sVar12 = auVar69._4_2_;
            sVar16 = auVar69._6_2_;
            sVar20 = auVar69._8_2_;
            sVar24 = auVar69._10_2_;
            sVar28 = auVar69._12_2_;
            sVar32 = auVar69._14_2_;
            auVar79._0_4_ = (iVar76 + iVar58 >> auVar54) + off0;
            auVar79._4_4_ = ((int)((ulong)auVar77._0_8_ >> 0x20) + iVar59 >> auVar54) + off0;
            auVar79._8_4_ = (auVar77._8_4_ + iVar60 >> auVar54) + off0;
            auVar79._12_4_ = (auVar78._12_4_ + iVar50 >> auVar54) + off0;
            auVar74 = packssdw(auVar73,auVar79);
            sVar75 = auVar74._0_2_;
            sVar9 = auVar74._2_2_;
            sVar13 = auVar74._4_2_;
            sVar17 = auVar74._6_2_;
            sVar21 = auVar74._8_2_;
            sVar25 = auVar74._10_2_;
            sVar29 = auVar74._12_2_;
            sVar33 = auVar74._14_2_;
            *(ulong *)(pu1_dst + lVar49) =
                 CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar55[0xe] - (0xff < sVar30),
                          CONCAT16((0 < sVar26) * (sVar26 < 0x100) * auVar55[0xc] - (0xff < sVar26),
                                   CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar55[10] -
                                            (0xff < sVar22),
                                            CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar55[8] -
                                                     (0xff < sVar18),
                                                     CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                              auVar55[6] - (0xff < sVar14),
                                                              CONCAT12((0 < sVar10) *
                                                                       (sVar10 < 0x100) * auVar55[4]
                                                                       - (0xff < sVar10),
                                                                       CONCAT11((0 < sVar6) *
                                                                                (sVar6 < 0x100) *
                                                                                auVar55[2] -
                                                                                (0xff < sVar6),
                                                                                (0 < sVar61) *
                                                                                (sVar61 < 0x100) *
                                                                                auVar55[0] -
                                                                                (0xff < sVar61))))))
                                  ));
            *(ulong *)(pu1_dst + lVar49 + dst_strd) =
                 CONCAT17((0 < sVar31) * (sVar31 < 0x100) * auVar66[0xe] - (0xff < sVar31),
                          CONCAT16((0 < sVar27) * (sVar27 < 0x100) * auVar66[0xc] - (0xff < sVar27),
                                   CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar66[10] -
                                            (0xff < sVar23),
                                            CONCAT14((0 < sVar19) * (sVar19 < 0x100) * auVar66[8] -
                                                     (0xff < sVar19),
                                                     CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                              auVar66[6] - (0xff < sVar15),
                                                              CONCAT12((0 < sVar11) *
                                                                       (sVar11 < 0x100) * auVar66[4]
                                                                       - (0xff < sVar11),
                                                                       CONCAT11((0 < sVar7) *
                                                                                (sVar7 < 0x100) *
                                                                                auVar66[2] -
                                                                                (0xff < sVar7),
                                                                                (0 < sVar67) *
                                                                                (sVar67 < 0x100) *
                                                                                auVar66[0] -
                                                                                (0xff < sVar67))))))
                                  ));
            *(ulong *)(pu1_dst + lVar49 + dst_strd * 2) =
                 CONCAT17((0 < sVar32) * (sVar32 < 0x100) * auVar69[0xe] - (0xff < sVar32),
                          CONCAT16((0 < sVar28) * (sVar28 < 0x100) * auVar69[0xc] - (0xff < sVar28),
                                   CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar69[10] -
                                            (0xff < sVar24),
                                            CONCAT14((0 < sVar20) * (sVar20 < 0x100) * auVar69[8] -
                                                     (0xff < sVar20),
                                                     CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                              auVar69[6] - (0xff < sVar16),
                                                              CONCAT12((0 < sVar12) *
                                                                       (sVar12 < 0x100) * auVar69[4]
                                                                       - (0xff < sVar12),
                                                                       CONCAT11((0 < sVar8) *
                                                                                (sVar8 < 0x100) *
                                                                                auVar69[2] -
                                                                                (0xff < sVar8),
                                                                                (0 < sVar70) *
                                                                                (sVar70 < 0x100) *
                                                                                auVar69[0] -
                                                                                (0xff < sVar70))))))
                                  ));
            *(ulong *)(pu1_dst + lVar49 + dst_strd * 3) =
                 CONCAT17((0 < sVar33) * (sVar33 < 0x100) * auVar74[0xe] - (0xff < sVar33),
                          CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar74[0xc] - (0xff < sVar29),
                                   CONCAT15((0 < sVar25) * (sVar25 < 0x100) * auVar74[10] -
                                            (0xff < sVar25),
                                            CONCAT14((0 < sVar21) * (sVar21 < 0x100) * auVar74[8] -
                                                     (0xff < sVar21),
                                                     CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                              auVar74[6] - (0xff < sVar17),
                                                              CONCAT12((0 < sVar13) *
                                                                       (sVar13 < 0x100) * auVar74[4]
                                                                       - (0xff < sVar13),
                                                                       CONCAT11((0 < sVar9) *
                                                                                (sVar9 < 0x100) *
                                                                                auVar74[2] -
                                                                                (0xff < sVar9),
                                                                                (0 < sVar75) *
                                                                                (sVar75 < 0x100) *
                                                                                auVar74[0] -
                                                                                (0xff < sVar75))))))
                                  ));
            pWVar48 = pWVar48 + 8;
            lVar49 = lVar49 + 8;
          } while ((int)lVar49 < wd);
          pu1_dst = pu1_dst + lVar49;
          pi2_src = pWVar48;
        }
        pi2_src = pi2_src + ((long)(src_strd << 2) - (long)wd);
        pu1_dst = pu1_dst + ((long)(dst_strd << 2) - (long)wd);
        iVar51 = iVar51 + 4;
      } while (iVar51 < ht);
    }
  }
  else if (0 < ht) {
    iVar51 = 0;
    auVar54 = ZEXT416((uint)shift);
    do {
      if (0 < wd) {
        lVar49 = 0;
        pWVar48 = pi2_src;
        do {
          uVar2 = *(undefined8 *)(pi2_src + src_strd * 2 + lVar49);
          uVar3 = *(undefined8 *)(pi2_src + lVar49);
          auVar96._8_8_ = uVar2;
          auVar96._0_8_ = uVar3;
          uVar4 = *(undefined8 *)(pi2_src + src_strd * 3 + lVar49);
          uVar5 = *(undefined8 *)(pi2_src + src_strd + lVar49);
          auVar84._8_8_ = uVar4;
          auVar84._0_8_ = uVar5;
          sVar61 = sVar57 * (short)((ulong)uVar3 >> 0x30);
          sVar67 = sVar57 * (short)((ulong)uVar5 >> 0x30);
          auVar55 = pmulhw(auVar96,auVar56);
          auVar66 = pmulhw(auVar84,auVar56);
          iVar63 = CONCAT22(auVar55._8_2_,sVar52 * (short)uVar2);
          auVar64._0_8_ =
               CONCAT26(auVar55._10_2_,CONCAT24(sVar57 * (short)((ulong)uVar2 >> 0x10),iVar63));
          auVar64._8_2_ = sVar52 * (short)((ulong)uVar2 >> 0x20);
          auVar64._10_2_ = auVar55._12_2_;
          auVar69._12_2_ = sVar57 * (short)((ulong)uVar2 >> 0x30);
          auVar69._0_12_ = auVar64;
          auVar69._14_2_ = auVar55._14_2_;
          iVar71 = CONCAT22(auVar66._8_2_,sVar52 * (short)uVar4);
          auVar72._0_8_ =
               CONCAT26(auVar66._10_2_,CONCAT24(sVar57 * (short)((ulong)uVar4 >> 0x10),iVar71));
          auVar72._8_2_ = sVar52 * (short)((ulong)uVar4 >> 0x20);
          auVar72._10_2_ = auVar66._12_2_;
          auVar94._12_2_ = sVar57 * (short)((ulong)uVar4 >> 0x30);
          auVar94._0_12_ = auVar72;
          auVar94._14_2_ = auVar66._14_2_;
          iVar45 = CONCAT22(auVar55._6_2_,sVar61);
          Var41 = CONCAT64(CONCAT42(iVar45,auVar55._4_2_),
                           CONCAT22(sVar52 * (short)((ulong)uVar3 >> 0x20),sVar61));
          auVar39._4_8_ = (long)((unkuint10)Var41 >> 0x10);
          auVar39._2_2_ = auVar55._2_2_;
          auVar39._0_2_ = sVar57 * (short)((ulong)uVar3 >> 0x10);
          iVar46 = CONCAT22(auVar66._6_2_,sVar67);
          Var42 = CONCAT64(CONCAT42(iVar46,auVar66._4_2_),
                           CONCAT22(sVar52 * (short)((ulong)uVar5 >> 0x20),sVar67));
          auVar40._4_8_ = (long)((unkuint10)Var42 >> 0x10);
          auVar40._2_2_ = auVar66._2_2_;
          auVar40._0_2_ = sVar57 * (short)((ulong)uVar5 >> 0x10);
          auVar55._0_4_ = (CONCAT22(auVar55._0_2_,sVar52 * (short)uVar3) + iVar58 >> auVar54) + off0
          ;
          auVar55._4_4_ = (auVar39._0_4_ + iVar59 >> auVar54) + off0;
          auVar55._8_4_ = ((int)((unkuint10)Var41 >> 0x10) + iVar60 >> auVar54) + off0;
          auVar55._12_4_ = (iVar45 + iVar50 >> auVar54) + off0;
          auVar93._0_4_ = (CONCAT22(auVar66._0_2_,sVar52 * (short)uVar5) + iVar58 >> auVar54) + off0
          ;
          auVar93._4_4_ = (auVar40._0_4_ + iVar59 >> auVar54) + off0;
          auVar93._8_4_ = ((int)((unkuint10)Var42 >> 0x10) + iVar60 >> auVar54) + off0;
          auVar93._12_4_ = (iVar46 + iVar50 >> auVar54) + off0;
          auVar55 = packssdw(auVar55,auVar93);
          auVar74._0_4_ = (iVar63 + iVar58 >> auVar54) + off0;
          auVar74._4_4_ = ((int)((ulong)auVar64._0_8_ >> 0x20) + iVar59 >> auVar54) + off0;
          auVar74._8_4_ = (auVar64._8_4_ + iVar60 >> auVar54) + off0;
          auVar74._12_4_ = (auVar69._12_4_ + iVar50 >> auVar54) + off0;
          auVar95._0_4_ = (iVar71 + iVar58 >> auVar54) + off0;
          auVar95._4_4_ = ((int)((ulong)auVar72._0_8_ >> 0x20) + iVar59 >> auVar54) + off0;
          auVar95._8_4_ = (auVar72._8_4_ + iVar60 >> auVar54) + off0;
          auVar95._12_4_ = (auVar94._12_4_ + iVar50 >> auVar54) + off0;
          auVar66 = packssdw(auVar74,auVar95);
          sVar61 = auVar55._0_2_;
          sVar67 = auVar55._2_2_;
          sVar70 = auVar55._4_2_;
          sVar75 = auVar55._6_2_;
          sVar6 = auVar55._8_2_;
          sVar7 = auVar55._10_2_;
          sVar8 = auVar55._12_2_;
          sVar9 = auVar55._14_2_;
          sVar10 = auVar66._0_2_;
          sVar11 = auVar66._2_2_;
          sVar12 = auVar66._4_2_;
          sVar13 = auVar66._6_2_;
          sVar14 = auVar66._8_2_;
          sVar15 = auVar66._10_2_;
          sVar16 = auVar66._12_2_;
          sVar17 = auVar66._14_2_;
          pUVar1 = pu1_dst + lVar49;
          *pUVar1 = (0 < sVar61) * (sVar61 < 0x100) * auVar55[0] - (0xff < sVar61);
          pUVar1[1] = (0 < sVar67) * (sVar67 < 0x100) * auVar55[2] - (0xff < sVar67);
          pUVar1[2] = (0 < sVar70) * (sVar70 < 0x100) * auVar55[4] - (0xff < sVar70);
          pUVar1[3] = (0 < sVar75) * (sVar75 < 0x100) * auVar55[6] - (0xff < sVar75);
          lVar47 = lVar49 + dst_strd;
          pu1_dst[lVar47 + 4] = (0 < sVar6) * (sVar6 < 0x100) * auVar55[8] - (0xff < sVar6);
          pu1_dst[lVar47 + 5] = (0 < sVar7) * (sVar7 < 0x100) * auVar55[10] - (0xff < sVar7);
          pu1_dst[lVar47 + 6] = (0 < sVar8) * (sVar8 < 0x100) * auVar55[0xc] - (0xff < sVar8);
          pu1_dst[lVar47 + 7] = (0 < sVar9) * (sVar9 < 0x100) * auVar55[0xe] - (0xff < sVar9);
          lVar47 = lVar49 + dst_strd * 2;
          pu1_dst[lVar47 + 8] = (0 < sVar10) * (sVar10 < 0x100) * auVar66[0] - (0xff < sVar10);
          pu1_dst[lVar47 + 9] = (0 < sVar11) * (sVar11 < 0x100) * auVar66[2] - (0xff < sVar11);
          pu1_dst[lVar47 + 10] = (0 < sVar12) * (sVar12 < 0x100) * auVar66[4] - (0xff < sVar12);
          pu1_dst[lVar47 + 0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar66[6] - (0xff < sVar13);
          lVar47 = lVar49 + dst_strd * 3;
          pu1_dst[lVar47 + 0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar66[8] - (0xff < sVar14);
          pu1_dst[lVar47 + 0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar66[10] - (0xff < sVar15);
          pu1_dst[lVar47 + 0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar66[0xc] - (0xff < sVar16);
          pu1_dst[lVar47 + 0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar66[0xe] - (0xff < sVar17);
          pWVar48 = pWVar48 + 4;
          lVar49 = lVar49 + 4;
        } while ((int)lVar49 < wd);
        pu1_dst = pu1_dst + lVar49;
        pi2_src = pWVar48;
      }
      pi2_src = pi2_src + (long)-wd + (long)(src_strd * 4);
      pu1_dst = pu1_dst + (long)(dst_strd * 4) + (long)-wd;
      iVar51 = iVar51 + 4;
    } while (iVar51 < ht);
  }
  return;
}

Assistant:

void ihevc_weighted_pred_uni_ssse3(WORD16 *pi2_src,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 dst_strd,
                                   WORD32 wgt0,
                                   WORD32 off0,
                                   WORD32 shift,
                                   WORD32 lvl_shift,
                                   WORD32 ht,
                                   WORD32 wd)
{
    WORD32 row, col, temp;

    /* all 128 bit registers are named with a suffix mxnb, where m is the */
    /* number of n bits packed in the register                            */
    __m128i src_temp0_8x16b, src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b;
    __m128i const_temp_4x32b, lvl_shift_4x32b, wgt0_8x16b, off0_4x32b;
    __m128i res_temp0_4x32b, res_temp1_4x32b, res_temp2_4x32b, res_temp3_4x32b;

    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    temp = 1 << (shift - 1);

    // seting values in register
    lvl_shift_4x32b = _mm_set1_epi16(lvl_shift);
    wgt0_8x16b = _mm_set1_epi16(wgt0);

    /* lvl_shift * wgt0 */
    res_temp0_4x32b = _mm_mullo_epi16(lvl_shift_4x32b, wgt0_8x16b);
    res_temp1_4x32b = _mm_mulhi_epi16(lvl_shift_4x32b, wgt0_8x16b);

    const_temp_4x32b = _mm_set1_epi32(temp);
    off0_4x32b = _mm_set1_epi32(off0);


    /* lvl_shift * wgt0 */
    lvl_shift_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, res_temp1_4x32b);
    /* lvl_shift * wgt0 + 1 << (shift - 1) */
    lvl_shift_4x32b = _mm_add_epi32(lvl_shift_4x32b, const_temp_4x32b);

    if(0 == (wd & 7)) /* wd multiple of 8 case */
    {
        __m128i res_temp4_4x32b, res_temp5_4x32b, res_temp6_4x32b, res_temp7_4x32b;

        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {   /* for row =0 ,1,2,3*/

                /* row = 0 */ /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp0_8x16b = _mm_loadu_si128((__m128i *)(pi2_src));
                /* row = 1 */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + src_strd));
                /* row = 2 */
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + 2 * src_strd));
                /* row = 3 */
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + 3 * src_strd));

                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Lower 16 bit */
                res_temp0_4x32b  = _mm_mullo_epi16(src_temp0_8x16b, wgt0_8x16b);
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt0_8x16b);
                res_temp3_4x32b  = _mm_mullo_epi16(src_temp3_8x16b, wgt0_8x16b);

                /*i4_tmp = (pi2_src[col] ) * wgt0*/ /* Higher 16 bit */
                src_temp0_8x16b  = _mm_mulhi_epi16(src_temp0_8x16b, wgt0_8x16b);
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt0_8x16b);
                src_temp3_8x16b  = _mm_mulhi_epi16(src_temp3_8x16b, wgt0_8x16b);

                /* Get 32 bit Result */
                res_temp4_4x32b = _mm_unpackhi_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp5_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp6_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp7_4x32b = _mm_unpackhi_epi16(res_temp3_4x32b, src_temp3_8x16b);

                res_temp0_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp3_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, src_temp3_8x16b);

                /* i4_tmp = (pi2_src[col] + lvl_shift) * wgt0 + 1 << (shift - 1) */
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, lvl_shift_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, lvl_shift_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, lvl_shift_4x32b);
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, lvl_shift_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift_4x32b);

                /* (i4_tmp >> shift) */ /* First 4 pixels */
                res_temp0_4x32b = _mm_srai_epi32(res_temp0_4x32b, shift);
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b, shift);
                res_temp2_4x32b = _mm_srai_epi32(res_temp2_4x32b, shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b, shift);

                /* (i4_tmp >> shift) */ /* Last 4 pixels */
                res_temp4_4x32b = _mm_srai_epi32(res_temp4_4x32b, shift);
                res_temp5_4x32b = _mm_srai_epi32(res_temp5_4x32b, shift);
                res_temp6_4x32b = _mm_srai_epi32(res_temp6_4x32b, shift);
                res_temp7_4x32b = _mm_srai_epi32(res_temp7_4x32b, shift);

                /*i4_tmp = (i4_tmp >> shift) + off0; */ /* First 4 pixels */
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, off0_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, off0_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, off0_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, off0_4x32b);

                /*i4_tmp = (i4_tmp >> shift) + off0; */ /* Last 4 pixels */
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, off0_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, off0_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, off0_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, off0_4x32b);

                res_temp0_4x32b = _mm_packs_epi32(res_temp0_4x32b, res_temp4_4x32b);
                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp5_4x32b);
                res_temp2_4x32b = _mm_packs_epi32(res_temp2_4x32b, res_temp6_4x32b);
                res_temp3_4x32b = _mm_packs_epi32(res_temp3_4x32b, res_temp7_4x32b);
                /* pu1_dst[col] = CLIP_U8(i4_tmp); */
                res_temp0_4x32b = _mm_packus_epi16(res_temp0_4x32b, res_temp0_4x32b);
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);
                res_temp2_4x32b = _mm_packus_epi16(res_temp2_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_packus_epi16(res_temp3_4x32b, res_temp3_4x32b);

                /* store four 8-bit output values  */
                _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), res_temp0_4x32b); /* row = 0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), res_temp1_4x32b); /* row = 2*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), res_temp2_4x32b); /* row = 1*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), res_temp3_4x32b); /* row = 3*/

                /* To update pointer */
                pi2_src += 8;
                pu1_dst += 8;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src = pi2_src - wd + 4 * src_strd;    /* Pointer update */
            pu1_dst = pu1_dst - wd + 4 * dst_strd; /* Pointer update */

        }
    }
    else  /* wd multiple of 4 case */
    {
        WORD32 dst0, dst1, dst2, dst3;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {   /* for row =0 ,1,2,3*/

                /* row = 0 */ /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp0_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src));
                /* row = 1 */
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + src_strd));
                /* row = 2 */
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + 2 * src_strd));
                /* row = 3 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + 3 * src_strd));

                /* 2 rows together */
                src_temp0_8x16b = _mm_unpacklo_epi64(src_temp0_8x16b, src_temp2_8x16b);
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);

                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Lower 16 bit */
                res_temp0_4x32b  = _mm_mullo_epi16(src_temp0_8x16b, wgt0_8x16b);
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Higher 16 bit */
                src_temp0_8x16b  = _mm_mulhi_epi16(src_temp0_8x16b, wgt0_8x16b);
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);

                /* Get 32 bit Result */
                res_temp2_4x32b = _mm_unpackhi_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp3_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);

                res_temp0_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);

                /* i4_tmp = (pi2_src[col] + lvl_shift) * wgt0 + 1 << (shift - 1) */
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift_4x32b);
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, lvl_shift_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift_4x32b);

                /* (i4_tmp >> shift) */
                res_temp0_4x32b = _mm_srai_epi32(res_temp0_4x32b, shift);
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b, shift);
                res_temp2_4x32b = _mm_srai_epi32(res_temp2_4x32b, shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b, shift);

                /*i4_tmp = (i4_tmp >> shift) + off0; */
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, off0_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, off0_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, off0_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, off0_4x32b);

                res_temp0_4x32b = _mm_packs_epi32(res_temp0_4x32b, res_temp1_4x32b);
                res_temp2_4x32b = _mm_packs_epi32(res_temp2_4x32b, res_temp3_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp); */
                res_temp0_4x32b = _mm_packus_epi16(res_temp0_4x32b, res_temp2_4x32b);

                dst0 = _mm_cvtsi128_si32(res_temp0_4x32b);
                /* dst row = 1 to 3 */
                res_temp1_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 1);
                res_temp2_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 2);
                res_temp3_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 3);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(res_temp1_4x32b);
                dst2 = _mm_cvtsi128_si32(res_temp2_4x32b);
                dst3 = _mm_cvtsi128_si32(res_temp3_4x32b);

                /* row = 1 to row = 3 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;
                *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2;
                *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3;

                /* To update pointer */
                pi2_src += 4;
                pu1_dst += 4;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src = pi2_src - wd + 4 * src_strd;    /* Pointer update */
            pu1_dst = pu1_dst - wd + 4 * dst_strd; /* Pointer update */

        }
    }
}